

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O0

void __thiscall booster::streambuf::~streambuf(streambuf *this)

{
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  (in_RDI->_M_t).super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>
  ._M_t.super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
  super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl =
       (io_device *)&PTR__streambuf_002e8da0;
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::~unique_ptr(in_RDI)
  ;
  hold_ptr<booster::streambuf::_data>::~hold_ptr((hold_ptr<booster::streambuf::_data> *)in_RDI);
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  std::streambuf::~streambuf(in_RDI);
  return;
}

Assistant:

streambuf::~streambuf()
	{
	}